

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_unit.cpp
# Opt level: O2

void anon_unknown.dwarf_7fba::test_art_iterator_lower_bound(void **param_1)

{
  _Bool _Var1;
  allocator_type *paVar2;
  pointer pVVar3;
  size_t i;
  ulong uVar4;
  initializer_list<const_char_*> __l;
  initializer_list<(anonymous_namespace)::Value> __l_00;
  initializer_list<const_char_*> __l_01;
  initializer_list<(anonymous_namespace)::Value> __l_02;
  initializer_list<const_char_*> __l_03;
  initializer_list<(anonymous_namespace)::Value> __l_04;
  art_t art;
  vector<const_char_*,_std::allocator<const_char_*>_> keys;
  vector<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_> values;
  art_iterator_t iterator;
  
  iterator.frames[0]._8_8_ = anon_var_dwarf_18b;
  iterator._16_8_ = anon_var_dwarf_177;
  iterator.frames[0].node = (art_node_t *)anon_var_dwarf_181;
  iterator._0_8_ = anon_var_dwarf_157;
  iterator.value = (art_val_t *)anon_var_dwarf_16d;
  paVar2 = (allocator_type *)&values;
  __l._M_len = 5;
  __l._M_array = (iterator)&iterator;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector(&keys,__l,paVar2);
  iterator.value = (art_val_t *)0x1;
  iterator.frames[0].node = (art_node_t *)0x2;
  iterator.frames[1].node = (art_node_t *)0x3;
  iterator.frames[2].node = (art_node_t *)0x4;
  iterator.frames[3].node = (art_node_t *)0x5;
  __l_00._M_len = 5;
  __l_00._M_array = (iterator)&iterator;
  std::vector<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>::vector
            (&values,__l_00,(allocator_type *)paVar2);
  art.root = (art_node_t *)0x0;
  pVVar3 = values.
           super__Vector_base<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>
           ._M_impl.super__Vector_impl_data._M_start;
  for (uVar4 = 0;
      uVar4 < (ulong)((long)keys.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)keys.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 3); uVar4 = uVar4 + 1) {
    art_insert((art_t *)&art,
               (art_key_chunk_t *)
               keys.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
               super__Vector_impl_data._M_start[uVar4],(art_val_t *)pVVar3);
    assert_art_valid(&art);
    pVVar3 = pVVar3 + 1;
  }
  art_init_iterator((art_iterator_t *)&iterator,(art_t *)&art,true);
  _Var1 = art_iterator_lower_bound
                    ((art_iterator_t *)&iterator,
                     (art_key_chunk_t *)
                     keys.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                     super__Vector_impl_data._M_start[2]);
  _assert_true((ulong)_Var1,"art_iterator_lower_bound(&iterator, (art_key_chunk_t*)keys[2])",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/art_unit.cpp"
               ,0x14f);
  assert_key_eq(iterator.key,
                (art_key_chunk_t *)
                keys.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                super__Vector_impl_data._M_start[2]);
  _Var1 = art_iterator_lower_bound((art_iterator_t *)&iterator,(art_key_chunk_t *)"000005");
  _assert_true((ulong)_Var1,"art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/art_unit.cpp"
               ,0x152);
  assert_key_eq(iterator.key,
                (art_key_chunk_t *)
                keys.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                super__Vector_impl_data._M_start[4]);
  art_free((art_t *)&art);
  std::_Vector_base<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>::
  ~_Vector_base(&values.
                 super__Vector_base<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>
               );
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
            (&keys.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>);
  iterator._16_8_ = anon_var_dwarf_181;
  iterator.frames[0].node = (art_node_t *)anon_var_dwarf_18b;
  iterator._0_8_ = anon_var_dwarf_157;
  iterator.value = (art_val_t *)anon_var_dwarf_177;
  paVar2 = (allocator_type *)&values;
  __l_01._M_len = 4;
  __l_01._M_array = (iterator)&iterator;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector(&keys,__l_01,paVar2);
  iterator.value = (art_val_t *)0x1;
  iterator.frames[0].node = (art_node_t *)0x3;
  iterator.frames[1].node = (art_node_t *)0x4;
  iterator.frames[2].node = (art_node_t *)0x5;
  __l_02._M_len = 4;
  __l_02._M_array = (iterator)&iterator;
  std::vector<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>::vector
            (&values,__l_02,(allocator_type *)paVar2);
  art.root = (art_node_t *)0x0;
  pVVar3 = values.
           super__Vector_base<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>
           ._M_impl.super__Vector_impl_data._M_start;
  for (uVar4 = 0;
      uVar4 < (ulong)((long)keys.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)keys.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 3); uVar4 = uVar4 + 1) {
    art_insert((art_t *)&art,
               (art_key_chunk_t *)
               keys.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
               super__Vector_impl_data._M_start[uVar4],(art_val_t *)pVVar3);
    assert_art_valid(&art);
    pVVar3 = pVVar3 + 1;
  }
  art_init_iterator((art_iterator_t *)&iterator,(art_t *)&art,true);
  _Var1 = art_iterator_lower_bound((art_iterator_t *)&iterator,(art_key_chunk_t *)"000002");
  _assert_true((ulong)_Var1,"art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key1)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/art_unit.cpp"
               ,0x164);
  assert_key_eq(iterator.key,
                (art_key_chunk_t *)
                keys.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                super__Vector_impl_data._M_start[1]);
  _Var1 = art_iterator_lower_bound((art_iterator_t *)&iterator,(art_key_chunk_t *)"000001");
  _assert_true((ulong)_Var1,"art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key2)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/art_unit.cpp"
               ,0x16a);
  assert_key_eq(iterator.key,
                (art_key_chunk_t *)
                *keys.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                 super__Vector_impl_data._M_start);
  art_free((art_t *)&art);
  std::_Vector_base<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>::
  ~_Vector_base(&values.
                 super__Vector_base<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>
               );
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
            (&keys.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>);
  iterator._16_8_ = anon_var_dwarf_2db;
  iterator._0_8_ = anon_var_dwarf_2c5;
  iterator.value = (art_val_t *)anon_var_dwarf_2d0;
  paVar2 = (allocator_type *)&values;
  __l_03._M_len = 3;
  __l_03._M_array = (iterator)&iterator;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector(&keys,__l_03,paVar2);
  iterator.value = (art_val_t *)0x1;
  iterator.frames[0].node = (art_node_t *)0x2;
  iterator.frames[1].node = (art_node_t *)0x3;
  __l_04._M_len = 3;
  __l_04._M_array = (iterator)&iterator;
  std::vector<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>::vector
            (&values,__l_04,(allocator_type *)paVar2);
  art.root = (art_node_t *)0x0;
  pVVar3 = values.
           super__Vector_base<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>
           ._M_impl.super__Vector_impl_data._M_start;
  for (uVar4 = 0;
      uVar4 < (ulong)((long)keys.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)keys.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 3); uVar4 = uVar4 + 1) {
    art_insert((art_t *)&art,
               (art_key_chunk_t *)
               keys.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
               super__Vector_impl_data._M_start[uVar4],(art_val_t *)pVVar3);
    assert_art_valid(&art);
    pVVar3 = pVVar3 + 1;
  }
  art_init_iterator((art_iterator_t *)&iterator,(art_t *)&art,true);
  _Var1 = art_iterator_lower_bound((art_iterator_t *)&iterator,(art_key_chunk_t *)"000201");
  _assert_true((ulong)_Var1,"art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/art_unit.cpp"
               ,0x17e);
  assert_key_eq(iterator.key,
                (art_key_chunk_t *)
                keys.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                super__Vector_impl_data._M_start[2]);
  _Var1 = art_iterator_lower_bound((art_iterator_t *)&iterator,(art_key_chunk_t *)"000099");
  _assert_true((ulong)_Var1,"art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/art_unit.cpp"
               ,0x185);
  assert_key_eq(iterator.key,
                (art_key_chunk_t *)
                *keys.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                 super__Vector_impl_data._M_start);
  _Var1 = art_iterator_lower_bound((art_iterator_t *)&iterator,(art_key_chunk_t *)"000300");
  _assert_true((ulong)_Var1,"art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/art_unit.cpp"
               ,0x18c);
  assert_key_eq(iterator.key,
                (art_key_chunk_t *)
                keys.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                super__Vector_impl_data._M_start[2]);
  _Var1 = art_iterator_next((art_iterator_t *)&iterator);
  _assert_true((ulong)!_Var1,"art_iterator_next(&iterator)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/art_unit.cpp"
               ,0x18e);
  _Var1 = art_iterator_lower_bound((art_iterator_t *)&iterator,(art_key_chunk_t *)"000300");
  _assert_true((ulong)_Var1,"art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/art_unit.cpp"
               ,400);
  assert_key_eq(iterator.key,
                (art_key_chunk_t *)
                keys.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                super__Vector_impl_data._M_start[2]);
  _Var1 = art_iterator_lower_bound((art_iterator_t *)&iterator,(art_key_chunk_t *)"000100");
  _assert_true((ulong)_Var1,"art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/art_unit.cpp"
               ,0x197);
  assert_key_eq(iterator.key,
                (art_key_chunk_t *)
                *keys.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                 super__Vector_impl_data._M_start);
  _Var1 = art_iterator_prev((art_iterator_t *)&iterator);
  _assert_true((ulong)!_Var1,"art_iterator_prev(&iterator)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/art_unit.cpp"
               ,0x199);
  _Var1 = art_iterator_lower_bound((art_iterator_t *)&iterator,(art_key_chunk_t *)"000100");
  _assert_true((ulong)_Var1,"art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/art_unit.cpp"
               ,0x19b);
  assert_key_eq(iterator.key,
                (art_key_chunk_t *)
                *keys.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                 super__Vector_impl_data._M_start);
  art_free((art_t *)&art);
  std::_Vector_base<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>::
  ~_Vector_base(&values.
                 super__Vector_base<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>
               );
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
            (&keys.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>);
  keys.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x1;
  values.
  super__Vector_base<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  art_insert((art_t *)&values,(art_key_chunk_t *)"000001",(art_val_t *)&keys);
  art_init_iterator((art_iterator_t *)&iterator,(art_t *)&values,true);
  _Var1 = art_iterator_lower_bound((art_iterator_t *)&iterator,(art_key_chunk_t *)"000001");
  _assert_true((ulong)_Var1,"art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key1)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/art_unit.cpp"
               ,0x1ab);
  assert_key_eq((art_key_chunk_t *)&iterator,(art_key_chunk_t *)"000001");
  _Var1 = art_iterator_lower_bound((art_iterator_t *)&iterator,(art_key_chunk_t *)"000000");
  _assert_true((ulong)_Var1,"art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key2)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/art_unit.cpp"
               ,0x1b0);
  assert_key_eq((art_key_chunk_t *)&iterator,(art_key_chunk_t *)"000001");
  _Var1 = art_iterator_lower_bound((art_iterator_t *)&iterator,(art_key_chunk_t *)"000002");
  _assert_true((ulong)!_Var1,"art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key3)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/art_unit.cpp"
               ,0x1b5);
  art_free((art_t *)&values);
  return;
}

Assistant:

DEFINE_TEST(test_art_iterator_lower_bound) {
    {
        std::vector<const char*> keys = {
            "000001", "000002", "000003", "000004", "001005",
        };
        std::vector<Value> values = {{1}, {2}, {3}, {4}, {5}};
        art_t art{NULL};
        for (size_t i = 0; i < keys.size(); ++i) {
            art_insert(&art, (art_key_chunk_t*)keys[i], &values[i]);
            assert_art_valid(&art);
        }

        art_iterator_t iterator = art_init_iterator(&art, true);
        assert_true(
            art_iterator_lower_bound(&iterator, (art_key_chunk_t*)keys[2]));
        assert_key_eq(iterator.key, (art_key_chunk_t*)keys[2]);
        const char* key = "000005";
        assert_true(art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key));
        assert_key_eq(iterator.key, (art_key_chunk_t*)keys[4]);
        art_free(&art);
    }
    {
        // Lower bound search within a node's children.
        std::vector<const char*> keys = {"000001", "000003", "000004",
                                         "001005"};
        std::vector<Value> values = {{1}, {3}, {4}, {5}};
        art_t art{NULL};
        for (size_t i = 0; i < keys.size(); ++i) {
            art_insert(&art, (art_key_chunk_t*)keys[i], &values[i]);
            assert_art_valid(&art);
        }
        art_iterator_t iterator = art_init_iterator(&art, true);

        const char* key1 = "000002";
        assert_true(
            art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key1));
        assert_key_eq(iterator.key, (art_key_chunk_t*)keys[1]);

        // Check that we can go backward within a node's children.
        const char* key2 = "000001";
        assert_true(
            art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key2));
        assert_key_eq(iterator.key, (art_key_chunk_t*)keys[0]);

        art_free(&art);
    }
    {
        // Lower bound search with leaf where prefix is equal but full key is
        // smaller.
        std::vector<const char*> keys = {"000100", "000200", "000300"};
        std::vector<Value> values = {{1}, {2}, {3}};
        art_t art{NULL};
        for (size_t i = 0; i < keys.size(); ++i) {
            art_insert(&art, (art_key_chunk_t*)keys[i], &values[i]);
            assert_art_valid(&art);
        }
        art_iterator_t iterator = art_init_iterator(&art, true);

        {
            const char* key = "000201";
            assert_true(
                art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key));
            assert_key_eq(iterator.key, (art_key_chunk_t*)keys[2]);
        }
        {
            // Check that we can go backward.
            const char* key = "000099";
            assert_true(
                art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key));
            assert_key_eq(iterator.key, (art_key_chunk_t*)keys[0]);
        }
        {
            // Check that we can go backward from after the end.
            const char* key = "000300";
            assert_true(
                art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key));
            assert_key_eq(iterator.key, (art_key_chunk_t*)keys[2]);
            assert_false(art_iterator_next(&iterator));
            assert_true(
                art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key));
            assert_key_eq(iterator.key, (art_key_chunk_t*)keys[2]);
        }
        {
            // Check that we can go forward from before the start.
            const char* key = "000100";
            assert_true(
                art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key));
            assert_key_eq(iterator.key, (art_key_chunk_t*)keys[0]);
            assert_false(art_iterator_prev(&iterator));
            assert_true(
                art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key));
            assert_key_eq(iterator.key, (art_key_chunk_t*)keys[0]);
        }

        art_free(&art);
    }
    {
        // Lower bound search with only a single leaf.
        const char* key1 = "000001";
        Value value{1};
        art_t art{NULL};
        art_insert(&art, (art_key_chunk_t*)key1, &value);

        art_iterator_t iterator = art_init_iterator(&art, true);

        assert_true(
            art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key1));
        assert_key_eq(iterator.key, (art_key_chunk_t*)key1);

        const char* key2 = "000000";
        assert_true(
            art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key2));
        assert_key_eq(iterator.key, (art_key_chunk_t*)key1);

        const char* key3 = "000002";
        assert_false(
            art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key3));

        art_free(&art);
    }
}